

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  
  plVar1 = (long *)cf->ctx;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x70))(cf);
    *(undefined4 *)(plVar1 + 0x17) = 0;
    Curl_ssl_peer_cleanup((ssl_peer *)(plVar1 + 1));
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  if(connssl) {
    connssl->ssl_impl->close(cf, data);
    connssl->state = ssl_connection_none;
    Curl_ssl_peer_cleanup(&connssl->peer);
  }
  cf->connected = FALSE;
}